

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O0

bool loadUpdateIndirectProgram
               (int programName,bool updateIndirectStruct,bool resetCounter1,bool resetCounter2,
               int updateOffset,int divideValue,int addValue)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *file;
  char local_438 [8];
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  int divideValue_local;
  int updateOffset_local;
  bool resetCounter2_local;
  bool resetCounter1_local;
  bool updateIndirectStruct_local;
  int programName_local;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Update-Indirect-Program}\n");
  fflush(_stdout);
  if (GLAD_GL_ARB_shader_atomic_counter_ops == 0) {
    if (GLAD_GL_AMD_shader_atomic_counter_ops != 0) {
      djgp_push_string(program_00,"#extension GL_AMD_shader_atomic_counter_ops : require\n");
      djgp_push_string(program_00,"#define ATOMIC_COUNTER_EXCHANGE_AMD 1\n");
    }
  }
  else {
    djgp_push_string(program_00,"#extension GL_ARB_shader_atomic_counter_ops : require\n");
    djgp_push_string(program_00,"#define ATOMIC_COUNTER_EXCHANGE_ARB 1\n");
  }
  djgp_push_string(program_00,"#define UPDATE_INDIRECT_STRUCT %i\n",(ulong)updateIndirectStruct);
  djgp_push_string(program_00,"#define UPDATE_INDIRECT_RESET_COUNTER1 %i\n",(ulong)resetCounter1);
  djgp_push_string(program_00,"#define UPDATE_INDIRECT_RESET_COUNTER2 %i\n",(ulong)resetCounter2);
  djgp_push_string(program_00,"#define BUFFER_BINDING_INDIRECT_COMMAND %i\n",8);
  djgp_push_string(program_00,"#define BINDING_ATOMIC_COUNTER %i\n",0);
  djgp_push_string(program_00,"#define BINDING_ATOMIC_COUNTER2 %i\n",1);
  djgp_push_string(program_00,"#define UPDATE_INDIRECT_OFFSET %i\n",(ulong)(uint)updateOffset);
  djgp_push_string(program_00,"#define UPDATE_INDIRECT_VALUE_DIVIDE %i\n",(ulong)(uint)divideValue);
  djgp_push_string(program_00,"#define UPDATE_INDIRECT_VALUE_ADD %i\n",(ulong)(uint)addValue);
  file = strcat2(local_438,g_app.dir.shader,"terrain_updateIndirect_cs.glsl");
  djgp_push_file(program_00,file);
  bVar1 = djgp_to_gl(program_00,0x1c2,false,true,g_gl.programs + programName);
  if (bVar1) {
    djgp_release(program_00);
    GVar2 = (*glad_glGetError)();
    updateIndirectStruct_local = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    updateIndirectStruct_local = false;
  }
  return updateIndirectStruct_local;
}

Assistant:

bool
loadUpdateIndirectProgram(
    int programName,
    bool updateIndirectStruct,
    bool resetCounter1,
    bool resetCounter2,
    int updateOffset,
    int divideValue,
    int addValue
) {
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[programName];
    char buf[1024];

    LOG("Loading {Update-Indirect-Program}\n");
    if (GLAD_GL_ARB_shader_atomic_counter_ops) {
        djgp_push_string(djp, "#extension GL_ARB_shader_atomic_counter_ops : require\n");
        djgp_push_string(djp, "#define ATOMIC_COUNTER_EXCHANGE_ARB 1\n");
    } else if (GLAD_GL_AMD_shader_atomic_counter_ops) {
        djgp_push_string(djp, "#extension GL_AMD_shader_atomic_counter_ops : require\n");
        djgp_push_string(djp, "#define ATOMIC_COUNTER_EXCHANGE_AMD 1\n");
    }

    djgp_push_string(djp, "#define UPDATE_INDIRECT_STRUCT %i\n", updateIndirectStruct ? 1 : 0);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_RESET_COUNTER1 %i\n", resetCounter1 ? 1 : 0);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_RESET_COUNTER2 %i\n", resetCounter2 ? 1 : 0);

    djgp_push_string(djp, "#define BUFFER_BINDING_INDIRECT_COMMAND %i\n", BUFFER_DISPATCH_INDIRECT);
    djgp_push_string(djp, "#define BINDING_ATOMIC_COUNTER %i\n", BINDING_ATOMIC_COUNTER);
    djgp_push_string(djp, "#define BINDING_ATOMIC_COUNTER2 %i\n", BINDING_ATOMIC_COUNTER2);

    djgp_push_string(djp, "#define UPDATE_INDIRECT_OFFSET %i\n", updateOffset);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_VALUE_DIVIDE %i\n", divideValue);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_VALUE_ADD %i\n", addValue);

    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "terrain_updateIndirect_cs.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    return (glGetError() == GL_NO_ERROR);
}